

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O1

bool __thiscall
Ptex::v2_2::PtexSeparableKernel::adjustMainToSubface(PtexSeparableKernel *this,int eid)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if ((this->res).ulog2 == '\0') {
    upresU(this);
  }
  if ((this->res).vlog2 == '\0') {
    upresV(this);
  }
  cVar1 = (this->res).ulog2;
  if ('\0' < cVar1) {
    (this->res).ulog2 = cVar1 + -1;
  }
  cVar1 = (this->res).vlog2;
  if ('\0' < cVar1) {
    (this->res).vlog2 = cVar1 + -1;
  }
  iVar4 = 1 << ((this->res).ulog2 & 0x1fU);
  iVar3 = 1 << ((this->res).vlog2 & 0x1fU);
  switch(eid & 3) {
  case 0:
    iVar2 = this->u;
    this->v = this->v - iVar3;
    if (iVar2 < iVar4) {
      return iVar2 < iVar4;
    }
    this->u = iVar2 - iVar4;
    break;
  case 1:
    iVar4 = this->v;
    if (iVar4 < iVar3) {
      return iVar4 < iVar3;
    }
    this->v = iVar4 - iVar3;
    break;
  case 2:
    iVar3 = this->u;
    if (iVar4 <= iVar3) {
      this->u = iVar3 - iVar4;
      return true;
    }
    return iVar4 <= iVar3;
  case 3:
    iVar2 = this->v;
    this->u = this->u - iVar4;
    if (iVar3 <= iVar2) {
      this->v = iVar2 - iVar3;
      return true;
    }
    return iVar3 <= iVar2;
  }
  return false;
}

Assistant:

bool adjustMainToSubface(int eid)
    {
        // to adjust the kernel for the subface, we must adjust the res down and offset the uv coords
        // however, if the res is already zero, we must upres the kernel first
        if (res.ulog2 == 0) upresU();
        if (res.vlog2 == 0) upresV();

        if (res.ulog2 > 0) res.ulog2--;
        if (res.vlog2 > 0) res.vlog2--;

        // offset uv coords and determine whether target subface is the primary one
        bool primary = 0;
        int resu = res.u(), resv = res.v();
        switch (eid&3) {
        case e_bottom:
            primary = (u < resu);
            v -= resv;
            if (!primary) u -= resu;
            break;
        case e_right:
            primary = (v < resv);
            if (!primary) v -= resv;
            break;
        case e_top:
            primary = (u >= resu);
            if (primary) u -= resu;
            break;
        case e_left:
            primary = (v >= resv);
            u -= resu;
            if (primary) v -= resv;
            break;
        }
        return primary;
    }